

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Position __thiscall AI::turn(AI *this,Position *other)

{
  Position PVar1;
  Position PVar2;
  long lVar3;
  
  PVar2.x = 0;
  PVar2.y = 0;
  do {
    lVar3 = 0;
    PVar1 = PVar2;
    do {
      if (*(int *)(*(long *)&(this->board->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[(long)PVar2].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + lVar3 * 4) == 0) {
        return PVar1;
      }
      lVar3 = lVar3 + 1;
      PVar1 = (Position)((long)PVar1 + 0x100000000);
    } while (lVar3 != 0xf);
    PVar2 = (Position)((long)PVar2 + 1);
  } while (PVar2 != (Position)0xf);
  PVar1.x = 0;
  PVar1.y = 0;
  return PVar1;
}

Assistant:

Position AI::turn(const Position &other) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    Position preferedPos = {0, 0};

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                preferedPos.x = i;
                preferedPos.y = j;
                return preferedPos;
            }
        }
    }

    return preferedPos;
}